

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int fts5NextMethod(sqlite3_vtab_cursor *pCursor)

{
  long iFirst;
  char *pcVar1;
  sqlite3_vtab *iRhs;
  Fts5Expr *pExpr;
  Fts5ExprNode *pFVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  bool bVar6;
  
  iVar3 = *(int *)&pCursor[4].pVtab;
  if (iVar3 < 3) {
    bVar6 = false;
    iVar3 = 0;
    if (((ulong)pCursor[10].pVtab & 0x20) != 0) {
      iFirst = ((Fts5Expr *)pCursor[8].pVtab)->pRoot->iRowid;
      iVar3 = sqlite3Fts5ExprFirst
                        ((Fts5Expr *)pCursor[8].pVtab,*(Fts5Index **)&pCursor->pVtab[1].nRef,iFirst,
                         *(int *)((long)&pCursor[4].pVtab + 4));
      bVar6 = false;
      pcVar1 = (pCursor[8].pVtab)->zErrMsg;
      if (iVar3 == 0) {
        bVar6 = iFirst != *(long *)(pcVar1 + 0x18);
      }
      uVar5 = *(uint *)&pCursor[10].pVtab & 0xffffff91;
      *(uint *)&pCursor[10].pVtab = uVar5 + 0x4e;
      if (*(int *)(pcVar1 + 4) != 0) {
        *(uint *)&pCursor[10].pVtab = uVar5 | 0x4f;
        return iVar3;
      }
    }
    if (!bVar6 && iVar3 == 0) {
      iRhs = pCursor[6].pVtab;
      pExpr = (Fts5Expr *)pCursor[8].pVtab;
      pFVar2 = pExpr->pRoot;
      do {
        iVar3 = (*pFVar2->xNext)(pExpr,pFVar2,0,0);
      } while (pFVar2->bNomatch != 0);
      iVar4 = fts5RowidCmp(pExpr,pFVar2->iRowid,(i64)iRhs);
      if (0 < iVar4) {
        pFVar2->bEof = 1;
      }
      *(uint *)&pCursor[10].pVtab =
           *(uint *)((pCursor[8].pVtab)->zErrMsg + 4) | *(uint *)&pCursor[10].pVtab | 0x4e;
    }
  }
  else {
    if (iVar3 == 4) {
      iVar3 = fts5SorterNext((Fts5Cursor *)pCursor);
      return iVar3;
    }
    if (iVar3 == 3) {
      *(byte *)&pCursor[10].pVtab = *(byte *)&pCursor[10].pVtab | 1;
      iVar3 = 0;
    }
    else {
      iVar4 = sqlite3_step((sqlite3_stmt *)pCursor[7].pVtab);
      iVar3 = 0;
      if (iVar4 != 100) {
        *(byte *)&pCursor[10].pVtab = *(byte *)&pCursor[10].pVtab | 1;
        iVar3 = sqlite3_reset((sqlite3_stmt *)pCursor[7].pVtab);
        return iVar3;
      }
    }
  }
  return iVar3;
}

Assistant:

static int fts5NextMethod(sqlite3_vtab_cursor *pCursor){
  Fts5Cursor *pCsr = (Fts5Cursor*)pCursor;
  int rc;

  assert( (pCsr->ePlan<3)==
          (pCsr->ePlan==FTS5_PLAN_MATCH || pCsr->ePlan==FTS5_PLAN_SOURCE) 
  );
  assert( !CsrFlagTest(pCsr, FTS5CSR_EOF) );

  if( pCsr->ePlan<3 ){
    int bSkip = 0;
    if( (rc = fts5CursorReseek(pCsr, &bSkip)) || bSkip ) return rc;
    rc = sqlite3Fts5ExprNext(pCsr->pExpr, pCsr->iLastRowid);
    CsrFlagSet(pCsr, sqlite3Fts5ExprEof(pCsr->pExpr));
    fts5CsrNewrow(pCsr);
  }else{
    switch( pCsr->ePlan ){
      case FTS5_PLAN_SPECIAL: {
        CsrFlagSet(pCsr, FTS5CSR_EOF);
        rc = SQLITE_OK;
        break;
      }
  
      case FTS5_PLAN_SORTED_MATCH: {
        rc = fts5SorterNext(pCsr);
        break;
      }
  
      default:
        rc = sqlite3_step(pCsr->pStmt);
        if( rc!=SQLITE_ROW ){
          CsrFlagSet(pCsr, FTS5CSR_EOF);
          rc = sqlite3_reset(pCsr->pStmt);
        }else{
          rc = SQLITE_OK;
        }
        break;
    }
  }
  
  return rc;
}